

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O2

void __thiscall DHUDMessage::ResetText(DHUDMessage *this,char *text)

{
  int iVar1;
  int iVar2;
  FBrokenLines *pFVar3;
  int iVar4;
  int iVar5;
  
  if (this->HUDWidth == 0) {
    iVar5 = active_con_scaletext();
    iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = CleanXfac;
    if (iVar5 != 0) {
      iVar2 = active_con_scaletext();
    }
    iVar4 = iVar4 / iVar2;
  }
  else {
    iVar4 = this->HUDWidth;
    if (this->WrapWidth != 0) {
      iVar4 = this->WrapWidth;
    }
  }
  if (this->Lines != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->Lines);
  }
  if (this->NoWrap != false) {
    iVar4 = 0x7fffffff;
  }
  iVar2 = 0;
  pFVar3 = V_BreakLines(this->Font,iVar4,(BYTE *)text,false);
  this->Lines = pFVar3;
  this->NumLines = 0;
  this->Width = 0;
  this->Height = 0;
  if (pFVar3 != (FBrokenLines *)0x0) {
    iVar4 = 1;
    iVar5 = 0;
    for (; iVar1 = pFVar3->Width, -1 < iVar1; pFVar3 = pFVar3 + 1) {
      iVar5 = iVar5 + this->Font->FontHeight;
      this->Height = iVar5;
      if (iVar2 <= iVar1) {
        iVar2 = iVar1;
      }
      this->Width = iVar2;
      this->NumLines = iVar4;
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void DHUDMessage::ResetText (const char *text)
{
	int width;

	if (HUDWidth != 0)
	{
		width = WrapWidth == 0 ? HUDWidth : WrapWidth;
	}
	else
	{
		switch (active_con_scaletext())
		{
		case 0: width = SCREENWIDTH / CleanXfac; break;
		default: width = SCREENWIDTH / active_con_scaletext(); break;
		}
	}

	if (Lines != NULL)
	{
		V_FreeBrokenLines (Lines);
	}

	Lines = V_BreakLines (Font, NoWrap ? INT_MAX : width, (BYTE *)text);

	NumLines = 0;
	Width = 0;
	Height = 0;

	if (Lines)
	{
		for (; Lines[NumLines].Width >= 0; NumLines++)
		{
			Height += Font->GetHeight ();
			Width = MAX<int> (Width, Lines[NumLines].Width);
		}
	}
}